

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

int cost_and_tokenize_map
              (Av1ColorMapParam *param,TokenExtra **t,int plane,int calc_rate,int allow_update_cdf,
              FRAME_COUNTS *counts)

{
  int iVar1;
  int nsymbs;
  int iVar2;
  int iVar3;
  int in_ECX;
  long *in_RSI;
  int *in_RDI;
  int in_R8D;
  int color_ctx;
  int color_new_idx;
  int i;
  int j;
  int k;
  int this_rate;
  int palette_size_idx;
  int n;
  int cols;
  int rows;
  int plane_block_width;
  ColorCost color_cost;
  MapCdf map_cdf;
  uint8_t *color_map;
  int local_80;
  int local_78;
  int local_70;
  int local_68;
  int local_64;
  int local_60;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint8_t *color_map_00;
  int local_4;
  
  color_map_00 = *(uint8_t **)(in_RDI + 6);
  lVar7 = *(long *)(in_RDI + 8);
  lVar6 = *(long *)(in_RDI + 10);
  iVar5 = in_RDI[3];
  iVar4 = *in_RDI;
  iVar1 = in_RDI[1];
  nsymbs = in_RDI[2];
  iVar2 = nsymbs + -2;
  local_60 = 0;
  for (local_64 = 1; local_64 < iVar4 + iVar1 + -1; local_64 = local_64 + 1) {
    if (local_64 < iVar1 + -1) {
      local_78 = local_64;
    }
    else {
      local_78 = iVar1 + -1;
    }
    local_68 = local_78;
    while( true ) {
      if ((local_64 - iVar4) + 1 < 0) {
        local_80 = 0;
      }
      else {
        local_80 = (local_64 - iVar4) + 1;
      }
      if (local_68 < local_80) break;
      iVar3 = av1_fast_palette_color_index_context
                        (color_map_00,(int)((ulong)lVar7 >> 0x20),(int)lVar7,
                         (int)((ulong)lVar6 >> 0x20),(int *)CONCAT44(iVar5,iVar4));
      if (in_ECX == 0) {
        *(byte *)*in_RSI = *(byte *)*in_RSI & 0xf8 | (byte)local_70 & 7;
        *(byte *)*in_RSI = *(byte *)*in_RSI & 0xf | (char)iVar3 << 4;
        *in_RSI = *in_RSI + 1;
        if (in_R8D != 0) {
          update_cdf((aom_cdf_prob *)(lVar7 + (long)iVar2 * 0x5a + (long)iVar3 * 0x12),
                     (byte)local_70,nsymbs);
        }
      }
      else {
        local_60 = *(int *)(lVar6 + (long)iVar2 * 0xa0 + (long)iVar3 * 0x20 + (long)local_70 * 4) +
                   local_60;
      }
      local_68 = local_68 + -1;
    }
  }
  if (in_ECX == 0) {
    local_4 = 0;
  }
  else {
    local_4 = local_60;
  }
  return local_4;
}

Assistant:

static int cost_and_tokenize_map(Av1ColorMapParam *param, TokenExtra **t,
                                 int plane, int calc_rate, int allow_update_cdf,
                                 FRAME_COUNTS *counts) {
  const uint8_t *const color_map = param->color_map;
  MapCdf map_cdf = param->map_cdf;
  ColorCost color_cost = param->color_cost;
  const int plane_block_width = param->plane_width;
  const int rows = param->rows;
  const int cols = param->cols;
  const int n = param->n_colors;
  const int palette_size_idx = n - PALETTE_MIN_SIZE;
  int this_rate = 0;

  (void)plane;
  (void)counts;

  for (int k = 1; k < rows + cols - 1; ++k) {
    for (int j = AOMMIN(k, cols - 1); j >= AOMMAX(0, k - rows + 1); --j) {
      int i = k - j;
      int color_new_idx;
      const int color_ctx = av1_fast_palette_color_index_context(
          color_map, plane_block_width, i, j, &color_new_idx);
      assert(color_new_idx >= 0 && color_new_idx < n);
      if (calc_rate) {
        this_rate += color_cost[palette_size_idx][color_ctx][color_new_idx];
      } else {
        (*t)->token = color_new_idx;
        (*t)->color_ctx = color_ctx;
        ++(*t);
        if (allow_update_cdf)
          update_cdf(map_cdf[palette_size_idx][color_ctx], color_new_idx, n);
#if CONFIG_ENTROPY_STATS
        if (plane) {
          ++counts->palette_uv_color_index[palette_size_idx][color_ctx]
                                          [color_new_idx];
        } else {
          ++counts->palette_y_color_index[palette_size_idx][color_ctx]
                                         [color_new_idx];
        }
#endif
      }
    }
  }
  if (calc_rate) return this_rate;
  return 0;
}